

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

void helper_set_user_reg_aarch64(CPUARMState_conflict *env,uint32_t regno,uint32_t val)

{
  if (regno == 0xe) {
    env->banked_r14[0] = val;
    return;
  }
  if (regno == 0xd) {
    env->banked_r13[0] = val;
    return;
  }
  if ((7 < regno) && ((env->uncached_cpsr & 0x1f) == 0x11)) {
    env->usr_regs[regno - 8] = val;
    return;
  }
  env->regs[regno] = val;
  return;
}

Assistant:

void HELPER(set_user_reg)(CPUARMState *env, uint32_t regno, uint32_t val)
{
    if (regno == 13) {
        env->banked_r13[BANK_USRSYS] = val;
    } else if (regno == 14) {
        env->banked_r14[BANK_USRSYS] = val;
    } else if (regno >= 8
               && (env->uncached_cpsr & 0x1f) == ARM_CPU_MODE_FIQ) {
        env->usr_regs[regno - 8] = val;
    } else {
        env->regs[regno] = val;
    }
}